

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfRelocator.cpp
# Opt level: O1

bool __thiscall
MipsElfRelocator::relocateOpcode
          (MipsElfRelocator *this,int type,RelocationData *data,
          vector<RelocationAction,_std::allocator<RelocationAction>_> *actions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  bool bVar1;
  uint op;
  uint local_48;
  int local_44;
  string local_40;
  
  local_48 = data->opcode;
  local_44 = type;
  switch(type) {
  case 2:
    local_48 = local_48 + (int)data->relocationBase;
    break;
  default:
    tinyformat::format<int>(&local_40,"Unknown MIPS relocation type %d",&local_44);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,&local_40
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return false;
  case 4:
    local_48 = ((uint)data->relocationBase >> 2) + local_48 & 0x3ffffff | local_48 & 0xfc000000;
    break;
  case 5:
    std::vector<MipsElfRelocator::Hi16Entry,std::allocator<MipsElfRelocator::Hi16Entry>>::
    emplace_back<long_const&,long_const&,unsigned_int_const&>
              ((vector<MipsElfRelocator::Hi16Entry,std::allocator<MipsElfRelocator::Hi16Entry>> *)
               &this->hi16Entries,&data->opcodeOffset,&data->relocationBase,&data->opcode);
    break;
  case 6:
    bVar1 = processHi16Entries(this,local_48,data->relocationBase,actions,errors);
    local_48 = CONCAT22(local_48._2_2_,(short)local_48 + (short)(int)data->relocationBase);
    goto LAB_001661ef;
  }
  bVar1 = true;
LAB_001661ef:
  std::vector<RelocationAction,std::allocator<RelocationAction>>::
  emplace_back<long_const&,unsigned_int&>
            ((vector<RelocationAction,std::allocator<RelocationAction>> *)actions,
             &data->opcodeOffset,&local_48);
  return bVar1;
}

Assistant:

bool MipsElfRelocator::relocateOpcode(int type, const RelocationData& data, std::vector<RelocationAction>& actions, std::vector<std::string>& errors)
{
	unsigned int op = data.opcode;
	bool result = true;

	switch (type)
	{
	case R_MIPS_26: //j, jal
		op = (op & 0xFC000000) | (((op&0x03FFFFFF)+(data.relocationBase>>2))&0x03FFFFFF);
		break;
	case R_MIPS_32:
		op += (int) data.relocationBase;
		break;
	case R_MIPS_HI16:
		hi16Entries.emplace_back(data.opcodeOffset, data.relocationBase, data.opcode);
		break;
	case R_MIPS_LO16:
		if (!processHi16Entries(op, data.relocationBase, actions, errors))
			result = false;
		op = (op&0xffff0000) | (((op&0xffff)+data.relocationBase)&0xffff);
		break;
	default:
		errors.emplace_back(tfm::format("Unknown MIPS relocation type %d",type));
		return false;
	}

	actions.emplace_back(data.opcodeOffset, op);
	return result;
}